

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

char * __thiscall CServer::ClientName(CServer *this,int ClientID)

{
  int iVar1;
  char *pcVar2;
  
  pcVar2 = "(invalid)";
  if ((uint)ClientID < 0x40) {
    iVar1 = this->m_aClients[(uint)ClientID].m_State;
    if (iVar1 != 0) {
      if (iVar1 == 5) {
        return this->m_aClients[(uint)ClientID].m_aName;
      }
      pcVar2 = "(connecting)";
    }
  }
  return pcVar2;
}

Assistant:

const char *CServer::ClientName(int ClientID) const
{
	if(ClientID < 0 || ClientID >= MAX_CLIENTS || m_aClients[ClientID].m_State == CServer::CClient::STATE_EMPTY)
		return "(invalid)";
	if(m_aClients[ClientID].m_State == CServer::CClient::STATE_INGAME)
		return m_aClients[ClientID].m_aName;
	else
		return "(connecting)";

}